

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_com.c
# Opt level: O0

void hal_vp9d_update_counts(void *buf,void *dxva)

{
  int iVar1;
  bool bVar2;
  uint local_48;
  RK_U32 com_len;
  RK_S32 ref_type;
  RK_U32 *eob_coef;
  int local_30;
  RK_S32 k;
  RK_S32 n;
  RK_S32 m;
  RK_S32 j;
  RK_S32 i;
  DXVA_PicParams_VP9 *s;
  void *dxva_local;
  void *buf_local;
  
  if (((*(ushort *)((long)dxva + 2) & 1) == 0) || ((*(ushort *)((long)dxva + 2) >> 7 & 1) != 0)) {
    local_48 = 0x188;
  }
  else {
    local_48 = 0x6a8;
  }
  _com_len = (int *)((long)buf + (ulong)local_48);
  memcpy((void *)((long)dxva + 0x8c8),buf,(ulong)local_48);
  bVar2 = true;
  if ((*(ushort *)((long)dxva + 2) & 1) != 0) {
    bVar2 = (*(ushort *)((long)dxva + 2) >> 7 & 1) != 0;
  }
  iVar1 = 1;
  if (!bVar2) {
    iVar1 = 2;
  }
  if (iVar1 == 1) {
    memset((void *)((long)dxva + 0x2a70),0,0x1200);
    memset((void *)((long)dxva + 0xf70),0,0x1b00);
  }
  for (m = 0; m < iVar1; m = m + 1) {
    for (n = 0; n < 4; n = n + 1) {
      for (k = 0; k < 2; k = k + 1) {
        for (local_30 = 0; local_30 < 6; local_30 = local_30 + 1) {
          for (eob_coef._4_4_ = 0; eob_coef._4_4_ < 6; eob_coef._4_4_ = eob_coef._4_4_ + 1) {
            *(int *)((long)dxva +
                    (long)eob_coef._4_4_ * 8 +
                    (long)local_30 * 0x30 +
                    (long)m * 0x120 + (long)k * 0x240 + (long)n * 0x480 + 0x2a70) = _com_len[1];
            *(int *)((long)dxva +
                    (long)eob_coef._4_4_ * 8 +
                    (long)local_30 * 0x30 + (long)m * 0x120 + (long)k * 0x240 + (long)n * 0x480 +
                    0x2a74) = *_com_len - _com_len[1];
            *(int *)((long)dxva +
                    (long)eob_coef._4_4_ * 0xc +
                    (long)local_30 * 0x48 +
                    (long)m * 0x1b0 + (long)k * 0x360 + (long)n * 0x6c0 + 0xf70) = _com_len[2];
            *(int *)((long)dxva +
                    (long)eob_coef._4_4_ * 0xc +
                    (long)local_30 * 0x48 + (long)m * 0x1b0 + (long)k * 0x360 + (long)n * 0x6c0 +
                    0xf74) = _com_len[3];
            *(int *)((long)dxva +
                    (long)eob_coef._4_4_ * 0xc +
                    (long)local_30 * 0x48 + (long)m * 0x1b0 + (long)k * 0x360 + (long)n * 0x6c0 +
                    0xf78) = _com_len[4];
            _com_len = _com_len + 5;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void hal_vp9d_update_counts(void *buf, void *dxva)
{
    DXVA_PicParams_VP9 *s = (DXVA_PicParams_VP9*)dxva;
    RK_S32 i, j, m, n, k;
    RK_U32 *eob_coef;
    RK_S32 ref_type;
#ifdef dump
    RK_U32 count_length;
#endif
    RK_U32 com_len = 0;

#ifdef dump
    if (!(s->frame_type == 0 || s->intra_only)) //inter
        count_length = (213 * 64 + 576 * 5 * 32) / 8;
    else //intra
        count_length = (49 * 64 + 288 * 5 * 32) / 8;

    fwrite(buf, 1, count_length, vp9_fp1);
    fflush(vp9_fp1);
#endif
    if ((s->frame_type == 0 || s->intra_only)) {
        com_len = sizeof(s->counts.partition) + sizeof(s->counts.skip) + sizeof(s->counts.intra)
                  + sizeof(s->counts.tx32p) + sizeof(s->counts.tx16p) + sizeof(s->counts.tx8p);
    } else {
        com_len = sizeof(s->counts) - sizeof(s->counts.coef) - sizeof(s->counts.eob);
    }
    eob_coef = (RK_U32 *)(buf + com_len);
    memcpy(&s->counts, buf, com_len);
    ref_type = (!(s->frame_type == 0 || s->intra_only)) ? 2 : 1;
    if (ref_type == 1) {
        memset(s->counts.eob, 0, sizeof(s->counts.eob));
        memset(s->counts.coef, 0, sizeof(s->counts.coef));
    }
    for (i = 0; i < ref_type; i++) {
        for (j = 0; j < 4; j++) {
            for (m = 0; m < 2; m++) {
                for (n = 0; n < 6; n++) {
                    for (k = 0; k < 6; k++) {
                        s->counts.eob[j][m][i][n][k][0] = eob_coef[1];
                        s->counts.eob[j][m][i][n][k][1] = eob_coef[0] - eob_coef[1]; //ffmpeg need do  branch_ct[UNCONSTRAINED_NODES][2] =  { neob, eob_counts[i][j][k][l] - neob },
                        s->counts.coef[j][m][i][n][k][0] = eob_coef[2];
                        s->counts.coef[j][m][i][n][k][1] = eob_coef[3];
                        s->counts.coef[j][m][i][n][k][2] = eob_coef[4];
                        eob_coef += 5;
                    }
                }
            }
        }
    }
}